

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageReceiver.cpp
# Opt level: O0

bool __thiscall
unixsocketipc::MessageReceiver::receive_buffer
          (MessageReceiver *this,int client_socket_fd,char *buf,uint32_t size)

{
  bool bVar1;
  ssize_t sVar2;
  int local_2c;
  uint local_28;
  int num_bytes_received;
  uint32_t num_bytes_left;
  uint32_t size_local;
  char *buf_local;
  int client_socket_fd_local;
  MessageReceiver *this_local;
  
  local_28 = size;
  _num_bytes_left = buf;
  while( true ) {
    bVar1 = false;
    if (local_28 != 0) {
      sVar2 = recv(client_socket_fd,_num_bytes_left,(ulong)local_28,0);
      local_2c = (int)sVar2;
      bVar1 = 0 < local_2c;
    }
    if (!bVar1) break;
    local_28 = local_28 - local_2c;
    _num_bytes_left = _num_bytes_left + local_2c;
  }
  return local_28 == 0;
}

Assistant:

bool MessageReceiver::receive_buffer(int client_socket_fd, char* buf, uint32_t size) {
   auto num_bytes_left = size;
   int num_bytes_received;
   while ((num_bytes_left > 0) && ((num_bytes_received = recv(client_socket_fd, buf, num_bytes_left, 0)) > 0)) {
      num_bytes_left -= num_bytes_received;
      buf += num_bytes_received;
      DEBUG_MSG("%s: received %d bytes\n", __FUNCTION__, num_bytes_received);
   }

   return (num_bytes_left == 0);
}